

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O1

void __thiscall indk::Neuron::Neuron(Neuron *this,Neuron *N)

{
  pointer *pppRVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppRVar4;
  pointer ppRVar5;
  iterator __position;
  _Alloc_hider *p_Var6;
  float *pfVar7;
  Receptor *pRVar8;
  Entry *E;
  long lVar9;
  Receptor *R;
  long lVar10;
  long EID;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  elabels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (this->OutputsPredefined).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OutputsPredefined).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OutputsPredefined).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Entries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Entries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Entries).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Links).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Links).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Links).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Receptors).
  super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Receptors).
  super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Receptors).
  super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  LOCK();
  (this->t).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  this->Tlo = N->Tlo;
  this->Xm = N->Xm;
  pfVar7 = (float *)operator_new(4);
  this->OutputSignal = pfVar7;
  this->OutputSignalSize = 1;
  this->OutputSignalPointer = 0;
  this->DimensionsCount = N->DimensionsCount;
  this->NID = 0;
  this->ProcessingMode = N->ProcessingMode;
  this->OutputMode = N->OutputMode;
  this->Learned = false;
  getEntries_abi_cxx11_(&local_60,N);
  ppVar2 = (N->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar3 = (N->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 != ppVar3 && -1 < (long)ppVar2 - (long)ppVar3) {
    lVar10 = 0;
    EID = 0;
    do {
      p_Var6 = &(local_60.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus;
      pRVar8 = (Receptor *)operator_new(0x40);
      E = getEntry(N,EID);
      Entry::Entry((Entry *)pRVar8,E);
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pRVar8;
      std::
      vector<std::pair<std::__cxx11::string,indk::Neuron::Entry*>,std::allocator<std::pair<std::__cxx11::string,indk::Neuron::Entry*>>>
      ::emplace_back<std::__cxx11::string&,indk::Neuron::Entry*>
                ((vector<std::pair<std::__cxx11::string,indk::Neuron::Entry*>,std::allocator<std::pair<std::__cxx11::string,indk::Neuron::Entry*>>>
                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&p_Var6->_M_p + lVar10),(Entry **)&local_78);
      EID = EID + 1;
      lVar9 = (long)(N->Entries).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(N->Entries).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      lVar10 = lVar10 + 0x20;
    } while (SBORROW8(EID,lVar9 * -0x3333333333333333) != EID + lVar9 * 0x3333333333333333 < 0);
  }
  ppRVar4 = (N->Receptors).
            super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppRVar5 = (N->Receptors).
            super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar4 != ppRVar5 && -1 < (long)ppRVar4 - (long)ppRVar5) {
    lVar10 = 0;
    do {
      pRVar8 = (Receptor *)operator_new(0x80);
      R = getReceptor(N,lVar10);
      Receptor::Receptor(pRVar8,R);
      __position._M_current =
           (this->Receptors).
           super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_78.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pRVar8;
      if (__position._M_current ==
          (this->Receptors).
          super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<indk::Neuron::Receptor*,std::allocator<indk::Neuron::Receptor*>>::
        _M_realloc_insert<indk::Neuron::Receptor*>
                  ((vector<indk::Neuron::Receptor*,std::allocator<indk::Neuron::Receptor*>> *)
                   &this->Receptors,__position,(Receptor **)&local_78);
      }
      else {
        *__position._M_current = pRVar8;
        pppRVar1 = &(this->Receptors).
                    super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppRVar1 = *pppRVar1 + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (long)(N->Receptors).
                            super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(N->Receptors).
                            super__Vector_base<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,&N->Links);
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->Links).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (this->Links).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->Links).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->Links).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->Links).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->Links).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  return;
}

Assistant:

indk::Neuron::Neuron(const indk::Neuron &N) {
    t = 0;
    Tlo = N.getTlo();
    Xm = N.getXm();
    OutputSignal = new float;
    OutputSignalSize = 1;
    OutputSignalPointer = 0;
    DimensionsCount = N.getDimensionsCount();
    NID = 0;
    ProcessingMode = N.getProcessingMode();
    OutputMode = N.getOutputMode();
    Learned = false;
    auto elabels = N.getEntries();
    for (int64_t i = 0; i < N.getEntriesCount(); i++) Entries.emplace_back(elabels[i], new Entry(*N.getEntry(i)));
    for (int64_t i = 0; i < N.getReceptorsCount(); i++) Receptors.push_back(new Receptor(*N.getReceptor(i)));
    Links = N.getLinkOutput();
}